

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

string * cmCTest::MakeURLSafe(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  string *psVar2;
  size_t sVar3;
  ulong uVar4;
  char buffer [10];
  ostringstream ost;
  char local_1c1;
  string *local_1c0;
  char local_1b2 [10];
  undefined1 local_1a8 [376];
  
  local_1c0 = __return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if (str->_M_string_length != 0) {
    uVar4 = 0;
    do {
      cVar1 = (str->_M_dataplus)._M_p[uVar4];
      if ((cVar1 == '\t') ||
         ((cVar1 != '@' && (cVar1 != '=' && cVar1 != '+')) &&
          (0xa0 < (byte)(cVar1 + 0x81U) && 1 < (byte)(cVar1 - 0x25U)))) {
        local_1c1 = cVar1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,&local_1c1,1);
      }
      else {
        sprintf(local_1b2,"%02x;");
        sVar3 = strlen(local_1b2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,local_1b2,sVar3);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < str->_M_string_length);
  }
  psVar2 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar2;
}

Assistant:

std::string cmCTest::MakeURLSafe(const std::string& str)
{
  std::ostringstream ost;
  char buffer[10];
  for (std::string::size_type pos = 0; pos < str.size(); pos++) {
    unsigned char ch = str[pos];
    if ((ch > 126 || ch < 32 || ch == '&' || ch == '%' || ch == '+' ||
         ch == '=' || ch == '@') &&
        ch != 9) {
      sprintf(buffer, "%02x;", (unsigned int)ch);
      ost << buffer;
    } else {
      ost << ch;
    }
  }
  return ost.str();
}